

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O1

int parse_canframe(char *cs,cu_t *cu)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  byte bVar11;
  byte bVar12;
  char cVar13;
  
  sVar4 = strlen(cs);
  memset(cu,0,0x810);
  if ((int)sVar4 < 4) {
    return 0;
  }
  if (cs[3] == '#') {
    bVar12 = 8;
    lVar5 = 0;
    do {
      cVar13 = cs[lVar5];
      bVar11 = cVar13 - 0x30;
      if (9 < bVar11) {
        if ((byte)(cVar13 + 0xbfU) < 6) {
          bVar11 = cVar13 - 0x37;
        }
        else {
          bVar11 = cVar13 + 0xa9;
          if (5 < (byte)(cVar13 + 0x9fU)) {
            bVar11 = 0x10;
          }
        }
      }
      if (0xf < bVar11) {
        return 0;
      }
      (cu->cc).can_id = (cu->cc).can_id | (uint)bVar11 << (bVar12 & 0x1f);
      lVar5 = lVar5 + 1;
      bVar12 = bVar12 - 4;
    } while (lVar5 != 3);
    uVar10 = 4;
  }
  else {
    if (cs[5] == '#') {
      lVar5 = 0;
      bVar12 = 0x10;
      do {
        cVar13 = cs[lVar5];
        bVar11 = cVar13 - 0x30;
        if (9 < bVar11) {
          if ((byte)(cVar13 + 0xbfU) < 6) {
            bVar11 = cVar13 - 0x37;
          }
          else {
            bVar11 = cVar13 + 0xa9;
            if (5 < (byte)(cVar13 + 0x9fU)) {
              bVar11 = 0x10;
            }
          }
        }
        if (0xf < bVar11) {
          return 0;
        }
        (cu->cc).can_id = (cu->cc).can_id | (uint)bVar11 << (bVar12 & 0x1f);
        lVar5 = lVar5 + 1;
        bVar12 = bVar12 - 4;
      } while (lVar5 != 5);
      uVar3 = (cu->cc).can_id & 0x7ff | ((cu->cc).can_id & 0xff000) << 4;
      uVar10 = 6;
    }
    else {
      if (cs[8] != '#') {
        return 0;
      }
      bVar12 = 0x1c;
      lVar5 = 0;
      do {
        cVar13 = cs[lVar5];
        bVar11 = cVar13 - 0x30;
        if (9 < bVar11) {
          if ((byte)(cVar13 + 0xbfU) < 6) {
            bVar11 = cVar13 - 0x37;
          }
          else {
            bVar11 = cVar13 + 0xa9;
            if (5 < (byte)(cVar13 + 0x9fU)) {
              bVar11 = 0x10;
            }
          }
        }
        if (0xf < bVar11) {
          return 0;
        }
        (cu->cc).can_id = (cu->cc).can_id | (uint)bVar11 << (bVar12 & 0x1f);
        lVar5 = lVar5 + 1;
        bVar12 = bVar12 - 4;
      } while (lVar5 != 8);
      uVar10 = 9;
      if (((cu->cc).can_id >> 0x1d & 1) != 0) goto LAB_001021ad;
      uVar3 = (cu->cc).can_id | 0x80000000;
      uVar10 = 9;
    }
    (cu->cc).can_id = uVar3;
  }
LAB_001021ad:
  cVar13 = cs[uVar10];
  if (cVar13 == '#') {
    cVar13 = cs[uVar10 + 1];
    bVar12 = cVar13 - 0x30U;
    if (9 < (byte)(cVar13 - 0x30U)) {
      if ((byte)(cVar13 + 0xbfU) < 6) {
        bVar12 = cVar13 - 0x37;
      }
      else {
        bVar12 = 0x10;
        if ((byte)(cVar13 + 0x9fU) < 6) {
          bVar12 = cVar13 + 0xa9;
        }
      }
    }
    if (0xf < bVar12) {
      return 0;
    }
    (cu->cc).__pad = bVar12 | 4;
    uVar10 = (ulong)((int)uVar10 + 2);
    iVar9 = 0x48;
    uVar3 = 0x40;
    cVar13 = '\0';
LAB_00102395:
    lVar5 = 8;
    bVar2 = false;
  }
  else {
    if ((cVar13 == 'r') || (cVar13 == 'R')) {
      cu->field3[3] = cu->field3[3] | 0x40;
      cVar13 = cs[uVar10 + 1];
      iVar9 = 0x10;
      if (cVar13 == '\0') {
        return 0x10;
      }
      bVar12 = cVar13 - 0x30U;
      if (9 < (byte)(cVar13 - 0x30U)) {
        if ((byte)(cVar13 + 0xbfU) < 6) {
          bVar12 = cVar13 - 0x37;
        }
        else {
          bVar12 = 0x10;
          if ((byte)(cVar13 + 0x9fU) < 6) {
            bVar12 = cVar13 + 0xa9;
          }
        }
      }
      if (8 < bVar12) {
        return 0x10;
      }
      (cu->fd).len = bVar12;
      if (bVar12 != 8) {
        return 0x10;
      }
      if (cs[uVar10 + 2] != '_') {
        return 0x10;
      }
      cVar13 = cs[uVar10 + 3];
      bVar12 = cVar13 - 0x30U;
      if (9 < (byte)(cVar13 - 0x30U)) {
        if ((byte)(cVar13 + 0xbfU) < 6) {
          bVar12 = cVar13 - 0x37;
        }
        else {
          bVar12 = 0x10;
          if ((byte)(cVar13 + 0x9fU) < 6) {
            bVar12 = cVar13 + 0xa9;
          }
        }
      }
      goto joined_r0x001024f1;
    }
    if (cs[uVar10 + 0xe] != '#') {
      iVar9 = 0x10;
      uVar3 = 8;
      cVar13 = '\x01';
      goto LAB_00102395;
    }
    if (cs[uVar10 + 2] != ':') {
      return 0;
    }
    if (cs[uVar10 + 5] != ':') {
      return 0;
    }
    bVar12 = cVar13 - 0x30U;
    if (9 < (byte)(cVar13 - 0x30U)) {
      if ((byte)(cVar13 + 0xbfU) < 6) {
        bVar12 = cVar13 - 0x37;
      }
      else {
        bVar12 = 0x10;
        if ((byte)(cVar13 + 0x9fU) < 6) {
          bVar12 = cVar13 + 0xa9;
        }
      }
    }
    if (0xf < bVar12) {
      return 0;
    }
    (cu->fd).len = bVar12 << 4;
    cVar13 = cs[uVar10 + 1];
    bVar11 = cVar13 - 0x30U;
    if (9 < (byte)(cVar13 - 0x30U)) {
      if ((byte)(cVar13 + 0xbfU) < 6) {
        bVar11 = cVar13 - 0x37;
      }
      else {
        bVar11 = 0x10;
        if ((byte)(cVar13 + 0x9fU) < 6) {
          bVar11 = cVar13 + 0xa9;
        }
      }
    }
    if (0xf < bVar11) {
      return 0;
    }
    (cu->fd).len = bVar12 << 4 | bVar11 | 0x80;
    cVar13 = cs[uVar10 + 3];
    bVar12 = cVar13 - 0x30U;
    if (9 < (byte)(cVar13 - 0x30U)) {
      if ((byte)(cVar13 + 0xbfU) < 6) {
        bVar12 = cVar13 - 0x37;
      }
      else {
        bVar12 = 0x10;
        if ((byte)(cVar13 + 0x9fU) < 6) {
          bVar12 = cVar13 + 0xa9;
        }
      }
    }
    if (0xf < bVar12) {
      return 0;
    }
    (cu->cc).__pad = bVar12 << 4;
    cVar13 = cs[uVar10 + 4];
    bVar11 = cVar13 - 0x30U;
    if (9 < (byte)(cVar13 - 0x30U)) {
      if ((byte)(cVar13 + 0xbfU) < 6) {
        bVar11 = cVar13 - 0x37;
      }
      else {
        bVar11 = 0x10;
        if ((byte)(cVar13 + 0x9fU) < 6) {
          bVar11 = cVar13 + 0xa9;
        }
      }
    }
    if (0xf < bVar11) {
      return 0;
    }
    (cu->cc).__pad = bVar11 | bVar12 << 4;
    iVar9 = 0x1c;
    do {
      cVar13 = cs[uVar10 + 6];
      bVar12 = cVar13 - 0x30;
      if (9 < bVar12) {
        if ((byte)(cVar13 + 0xbfU) < 6) {
          bVar12 = cVar13 - 0x37;
        }
        else {
          bVar12 = cVar13 + 0xa9;
          if (5 < (byte)(cVar13 + 0x9fU)) {
            bVar12 = 0x10;
          }
        }
      }
      if (0xf < bVar12) {
        return 0;
      }
      bVar11 = (byte)iVar9 & 0x1f;
      (cu->xl).af = (cu->xl).af | (uint)bVar12 << bVar11;
      uVar10 = uVar10 + 1;
      iVar9 = iVar9 + -4;
    } while (iVar9 != -4);
    lVar5 = 0xc;
    iVar9 = 0x80c;
    bVar2 = true;
    uVar3 = 0x800;
    cVar13 = (char)(0 << bVar11);
    uVar10 = (ulong)((int)uVar10 + 7);
  }
  uVar6 = 0;
  do {
    uVar8 = (int)uVar10 + (uint)(cs[(int)uVar10] == '.');
    uVar7 = uVar6;
    if ((int)sVar4 <= (int)uVar8) break;
    cVar1 = cs[(int)uVar8];
    bVar12 = cVar1 - 0x30;
    if (9 < bVar12) {
      if ((byte)(cVar1 + 0xbfU) < 6) {
        bVar12 = cVar1 - 0x37;
      }
      else if ((byte)(cVar1 + 0x9fU) < 6) {
        bVar12 = cVar1 + 0xa9;
      }
      else {
        bVar12 = 0x10;
      }
    }
    if (0xf < bVar12) {
      return 0;
    }
    cu->field3[uVar6 + lVar5] = bVar12 << 4;
    cVar1 = cs[(long)(int)uVar8 + 1];
    bVar11 = cVar1 - 0x30;
    if (9 < bVar11) {
      if ((byte)(cVar1 + 0xbfU) < 6) {
        bVar11 = cVar1 - 0x37;
      }
      else if ((byte)(cVar1 + 0x9fU) < 6) {
        bVar11 = cVar1 + 0xa9;
      }
      else {
        bVar11 = 0x10;
      }
    }
    if (0xf < bVar11) {
      return 0;
    }
    uVar8 = uVar8 + 2;
    uVar10 = (ulong)uVar8;
    cu->field3[uVar6 + lVar5] = bVar11 | bVar12 << 4;
    uVar6 = uVar6 + 1;
    uVar7 = (ulong)uVar3;
  } while (uVar3 != uVar6);
  if (bVar2) {
    (cu->xl).len = (__u16)uVar7;
  }
  else {
    (cu->fd).len = (__u8)uVar7;
  }
  if (cVar13 != '\x01' || (int)uVar7 != 8) {
    return iVar9;
  }
  if (cs[(int)uVar8] != '_') {
    return iVar9;
  }
  cVar13 = cs[(long)(int)uVar8 + 1];
  bVar12 = cVar13 - 0x30U;
  if (9 < (byte)(cVar13 - 0x30U)) {
    if ((byte)(cVar13 + 0xbfU) < 6) {
      bVar12 = cVar13 - 0x37;
    }
    else {
      bVar12 = 0x10;
      if ((byte)(cVar13 + 0x9fU) < 6) {
        bVar12 = cVar13 + 0xa9;
      }
    }
  }
joined_r0x001024f1:
  if ((byte)(bVar12 - 9) < 7) {
    (cu->cc).len8_dlc = bVar12;
  }
  return iVar9;
}

Assistant:

int parse_canframe(char *cs, cu_t *cu)
{
	/* documentation see lib.h */

	int i, idx, dlen, len;
	int maxdlen = CAN_MAX_DLEN;
	int mtu = CAN_MTU;
	__u8 *data = cu->fd.data; /* fill CAN CC/FD data by default */
	canid_t tmp;

	len = strlen(cs);
	//printf("'%s' len %d\n", cs, len);

	memset(cu, 0, sizeof(*cu)); /* init CAN CC/FD/XL frame, e.g. LEN = 0 */

	if (len < 4)
		return 0;

	if (cs[3] == CANID_DELIM) { /* 3 digits SFF */

		idx = 4;
		for (i = 0; i < 3; i++) {
			if ((tmp = asc2nibble(cs[i])) > 0x0F)
				return 0;
			cu->cc.can_id |= tmp << (2 - i) * 4;
		}

	} else if (cs[5] == CANID_DELIM) { /* 5 digits CAN XL VCID/PRIO*/

		idx = 6;
		for (i = 0; i < 5; i++) {
			if ((tmp = asc2nibble(cs[i])) > 0x0F)
				return 0;
			cu->xl.prio |= tmp << (4 - i) * 4;
		}

		/* the VCID starts at bit position 16 */
		tmp = (cu->xl.prio << 4) & CANXL_VCID_MASK;
		cu->xl.prio &= CANXL_PRIO_MASK;
		cu->xl.prio |= tmp;

	} else if (cs[8] == CANID_DELIM) { /* 8 digits EFF */

		idx = 9;
		for (i = 0; i < 8; i++) {
			if ((tmp = asc2nibble(cs[i])) > 0x0F)
				return 0;
			cu->cc.can_id |= tmp << (7 - i) * 4;
		}
		if (!(cu->cc.can_id & CAN_ERR_FLAG)) /* 8 digits but no errorframe?  */
			cu->cc.can_id |= CAN_EFF_FLAG;   /* then it is an extended frame */

	} else
		return 0;

	if ((cs[idx] == 'R') || (cs[idx] == 'r')) { /* RTR frame */
		cu->cc.can_id |= CAN_RTR_FLAG;

		/* check for optional DLC value for CAN 2.0B frames */
		if (cs[++idx] && (tmp = asc2nibble(cs[idx++])) <= CAN_MAX_DLEN) {
			cu->cc.len = tmp;

			/* check for optional raw DLC value for CAN 2.0B frames */
			if ((tmp == CAN_MAX_DLEN) && (cs[idx++] == CC_DLC_DELIM)) {
				tmp = asc2nibble(cs[idx]);
				if ((tmp > CAN_MAX_DLEN) && (tmp <= CAN_MAX_RAW_DLC))
					cu->cc.len8_dlc = tmp;
			}
		}
		return mtu;
	}

	if (cs[idx] == CANID_DELIM) { /* CAN FD frame escape char '##' */
		maxdlen = CANFD_MAX_DLEN;
		mtu = CANFD_MTU;

		/* CAN FD frame <canid>##<flags><data>* */
		if ((tmp = asc2nibble(cs[idx + 1])) > 0x0F)
			return 0;

		cu->fd.flags = tmp;
		cu->fd.flags |= CANFD_FDF; /* dual-use */
		idx += 2;

	} else if (cs[idx + 14] == CANID_DELIM) { /* CAN XL frame '#80:00:11223344#' */
		maxdlen = CANXL_MAX_DLEN;
		mtu = CANXL_MTU;
		data = cu->xl.data; /* fill CAN XL data */

		if ((cs[idx + 2] != XL_HDR_DELIM) || (cs[idx + 5] != XL_HDR_DELIM))
			return 0;

		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		cu->xl.flags = tmp << 4;
		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		cu->xl.flags |= tmp;

		/* force CAN XL flag if it was missing in the ASCII string */
		cu->xl.flags |= CANXL_XLF;

		idx++; /* skip XL_HDR_DELIM */

		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		cu->xl.sdt = tmp << 4;
		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		cu->xl.sdt |= tmp;

		idx++; /* skip XL_HDR_DELIM */

		for (i = 0; i < 8; i++) {
			if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
				return 0;
			cu->xl.af |= tmp << (7 - i) * 4;
		}

		idx++; /* skip CANID_DELIM */
	}

	for (i = 0, dlen = 0; i < maxdlen; i++) {
		if (cs[idx] == DATA_SEPERATOR) /* skip (optional) separator */
			idx++;

		if (idx >= len) /* end of string => end of data */
			break;

		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		data[i] = tmp << 4;
		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		data[i] |= tmp;
		dlen++;
	}

	if (mtu == CANXL_MTU)
		cu->xl.len = dlen;
	else
		cu->fd.len = dlen;

	/* check for extra DLC when having a Classic CAN with 8 bytes payload */
	if ((maxdlen == CAN_MAX_DLEN) && (dlen == CAN_MAX_DLEN) && (cs[idx++] == CC_DLC_DELIM)) {
		unsigned char dlc = asc2nibble(cs[idx]);

		if ((dlc > CAN_MAX_DLEN) && (dlc <= CAN_MAX_RAW_DLC))
			cu->cc.len8_dlc = dlc;
	}

	return mtu;
}